

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_isdir.cxx
# Opt level: O0

int fl_filename_isdir(char *n)

{
  int iVar1;
  size_t sVar2;
  bool local_8ad;
  undefined1 local_8a8 [4];
  int length;
  char fn [2048];
  undefined1 local_a0 [8];
  stat s;
  char *n_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)n;
  sVar2 = strlen(n);
  iVar1 = (int)sVar2;
  if ((1 < iVar1) && (*(char *)(s.__glibc_reserved[2] + (iVar1 + -1)) == '/')) {
    memcpy(local_8a8,(void *)s.__glibc_reserved[2],(long)(iVar1 + -1));
    local_8a8[iVar1 + -1] = 0;
    s.__glibc_reserved[2] = (__syscall_slong_t)local_8a8;
  }
  iVar1 = fl_stat((char *)s.__glibc_reserved[2],(stat *)local_a0);
  local_8ad = iVar1 == 0 && ((uint)s.st_nlink & 0xf000) == 0x4000;
  return (int)local_8ad;
}

Assistant:

int fl_filename_isdir(const char* n) {
  struct stat	s;
  char		fn[FL_PATH_MAX];
  int		length;

  length = (int) strlen(n);

#ifdef WIN32
  // This workaround brought to you by the fine folks at Microsoft!
  // (read lots of sarcasm in that...)
  if (length < (int)(sizeof(fn) - 1)) {
    if (length < 4 && isalpha(n[0]) && n[1] == ':' &&
        (isdirsep(n[2]) || !n[2])) {
      // Always use D:/ for drive letters
      fn[0] = n[0];
      strcpy(fn + 1, ":/");
      n = fn;
    } else if (length > 0 && isdirsep(n[length - 1])) {
      // Strip trailing slash from name...
      length --;
      memcpy(fn, n, length);
      fn[length] = '\0';
      n = fn;
    }
  }
#else
  // Matt: Just in case, we strip the slash for other operating
  // systems as well, avoid bugs by sloppy implementations
  // of "stat".
  if (length > 1 && isdirsep(n[length - 1])) {
    length --;
    memcpy(fn, n, length);
    fn[length] = '\0';
    n = fn;
  }
#endif

  return !fl_stat(n, &s) && (s.st_mode&0170000)==0040000;
}